

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

vector<RPCResult,_std::allocator<RPCResult>_> *
Cat<std::vector<RPCResult,std::allocator<RPCResult>>>
          (vector<RPCResult,_std::allocator<RPCResult>_> *__return_storage_ptr__,
          vector<RPCResult,_std::allocator<RPCResult>_> v1,
          vector<RPCResult,_std::allocator<RPCResult>_> *v2)

{
  long lVar1;
  RPCResult *pRVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long *in_RDX;
  RPCResult *arg;
  RPCResult *__args;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::reserve
            (v2,((long)(v2->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(v2->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
                      super__Vector_impl_data._M_start) / 0x88 + (in_RDX[1] - *in_RDX) / 0x88);
  pRVar2 = (RPCResult *)in_RDX[1];
  for (__args = (RPCResult *)*in_RDX; __args != pRVar2; __args = __args + 1) {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::emplace_back<RPCResult>(v2,__args);
  }
  uVar3 = *(undefined4 *)
           ((long)&(v2->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
                   super__Vector_impl_data._M_start + 4);
  uVar4 = *(undefined4 *)
           &(v2->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar5 = *(undefined4 *)
           ((long)&(v2->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
                   super__Vector_impl_data._M_finish + 4);
  *(undefined4 *)
   &(__return_storage_ptr__->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
    super__Vector_impl_data._M_start =
       *(undefined4 *)
        &(v2->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
         super__Vector_impl_data._M_start;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>).
           _M_impl.super__Vector_impl_data._M_start + 4) = uVar3;
  *(undefined4 *)
   &(__return_storage_ptr__->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
    super__Vector_impl_data._M_finish = uVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>).
           _M_impl.super__Vector_impl_data._M_finish + 4) = uVar5;
  (__return_storage_ptr__->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (v2->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (v2->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (v2->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (v2->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline V Cat(V v1, V&& v2)
{
    v1.reserve(v1.size() + v2.size());
    for (auto& arg : v2) {
        v1.push_back(std::move(arg));
    }
    return v1;
}